

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::DBTest_MultiThreaded_Test::TestBody(DBTest_MultiThreaded_Test *this)

{
  atomic<bool> *paVar1;
  SpecialEnv *pSVar2;
  bool bVar3;
  long lVar4;
  int id;
  int id_1;
  MTThread *pMVar5;
  MTState mt;
  MTThread thread [4];
  
  do {
    mt.stop._M_base._M_i = (__atomic_base<bool>)false;
    for (lVar4 = -4; lVar4 != 0; lVar4 = lVar4 + 1) {
      paVar1 = mt.thread_done + lVar4 * 4;
      paVar1->_M_base = (__atomic_base<bool>)0x0;
      paVar1[1] = (__atomic_base<bool>)0x0;
      paVar1[2] = (__atomic_base<bool>)0x0;
      paVar1[3] = (__atomic_base<bool>)0x0;
      *(undefined1 *)((long)&thread[0].state + lVar4) = 0;
    }
    pMVar5 = thread;
    lVar4 = 0;
    mt.test = &this->super_DBTest;
    for (; lVar4 != 4; lVar4 = lVar4 + 1) {
      pMVar5->state = &mt;
      pMVar5->id = (int)lVar4;
      pSVar2 = (this->super_DBTest).env_;
      (*(pSVar2->super_EnvWrapper).super_Env._vptr_Env[0x12])
                (pSVar2,anon_unknown_4::MTThreadBody,pMVar5);
      pMVar5 = pMVar5 + 1;
    }
    anon_unknown_4::DelayMilliseconds(10000);
    mt.stop._M_base._M_i = (__atomic_base<bool>)true;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      while ((mt.thread_done[lVar4]._M_base._M_i & 1U) == 0) {
        anon_unknown_4::DelayMilliseconds(100);
      }
    }
    bVar3 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar3);
  return;
}

Assistant:

TEST_F(DBTest, MultiThreaded) {
  do {
    // Initialize state
    MTState mt;
    mt.test = this;
    mt.stop.store(false, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      mt.counter[id].store(false, std::memory_order_release);
      mt.thread_done[id].store(false, std::memory_order_release);
    }

    // Start threads
    MTThread thread[kNumThreads];
    for (int id = 0; id < kNumThreads; id++) {
      thread[id].state = &mt;
      thread[id].id = id;
      env_->StartThread(MTThreadBody, &thread[id]);
    }

    // Let them run for a while
    DelayMilliseconds(kTestSeconds * 1000);

    // Stop the threads and wait for them to finish
    mt.stop.store(true, std::memory_order_release);
    for (int id = 0; id < kNumThreads; id++) {
      while (!mt.thread_done[id].load(std::memory_order_acquire)) {
        DelayMilliseconds(100);
      }
    }
  } while (ChangeOptions());
}